

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O2

void Pdr_InvPrint(Vec_Int_t *vInv,int fVerbose)

{
  int iVar1;
  char *__ptr;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  Vec_Str_t *__ptr_00;
  
  uVar2 = Vec_IntEntry(vInv,0);
  iVar1 = vInv->nSize;
  iVar3 = Vec_IntEntry(vInv,0);
  uVar4 = Pdr_InvUsedFlopNum(vInv);
  pVVar6 = vInv;
  uVar5 = Vec_IntEntryLast(vInv);
  Abc_Print((int)pVVar6,"Invariant contains %d clauses with %d literals and %d flops (out of %d).\n"
            ,(ulong)uVar2,(ulong)((iVar1 - iVar3) - 2),(ulong)uVar4,(ulong)uVar5);
  if (fVerbose != 0) {
    pVVar6 = Pdr_InvCounts(vInv);
    __ptr_00 = Pdr_InvPrintStr(vInv,pVVar6);
    __ptr = __ptr_00->pArray;
    Abc_Print((int)vInv,"%s",__ptr);
    Vec_IntFree(pVVar6);
    free(__ptr);
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

void Pdr_InvPrint( Vec_Int_t * vInv, int fVerbose )
{
    Abc_Print(1, "Invariant contains %d clauses with %d literals and %d flops (out of %d).\n", Vec_IntEntry(vInv, 0), Vec_IntSize(vInv)-Vec_IntEntry(vInv, 0)-2, Pdr_InvUsedFlopNum(vInv), Vec_IntEntryLast(vInv) );
    if ( fVerbose )
    {
        Vec_Int_t * vCounts = Pdr_InvCounts( vInv );
        Vec_Str_t * vStr = Pdr_InvPrintStr( vInv, vCounts );
        Abc_Print(1, "%s", Vec_StrArray( vStr ) );
        Vec_IntFree( vCounts );
        Vec_StrFree( vStr );
    }
}